

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void GC::CheckFunction(char *ptr)

{
  uint newSize;
  void *ptr_00;
  ulong uVar1;
  char ***pppcVar2;
  char *pcVar3;
  long lVar4;
  NULLCFuncPtr *fPtr;
  char *pcStack_8;
  
  if (*(long *)ptr != 0) {
    if (*(uint *)(NULLC::commonLinker + 0x24c) <= *(uint *)(ptr + 8)) {
      pcStack_8 = NULLC::commonLinker;
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    pcStack_8 = *(char **)(NULLC::commonLinker + 0x240);
    lVar4 = (ulong)*(uint *)(ptr + 8) * 0x94;
    if ((*(int *)(pcStack_8 + lVar4 + 4) != -1) && (*(int *)(pcStack_8 + lVar4 + 0x4c) != -1)) {
      ptr_00 = *(void **)ptr;
      if (((void *)0x10000 < ptr_00) && ((ptr_00 < unmanageableBase || (unmanageableTop < ptr_00))))
      {
        pcVar3 = (char *)NULLC::GetBasePointer(ptr_00);
        if (pcVar3 != (char *)0x0) {
          uVar1 = *(ulong *)(pcVar3 + -8);
          if ((uVar1 & 2) != 0) {
            __assert_fail("!\"reached a freed pointer\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                          ,0x2e5,"void GC::PrintMarker(markerType)");
          }
          if ((uVar1 & 1) == 0) {
            *(ulong *)(pcVar3 + -8) = uVar1 | 1;
            if (*(uint *)(NULLC::commonLinker + 0x20c) <= (uint)(uVar1 >> 8)) {
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x7f,
                            "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                           );
            }
            if (*(int *)(*(long *)(NULLC::commonLinker + 0x200) + 0x10 +
                        (uVar1 >> 8 & 0xffffffff) * 0x50) != 0) {
              newSize = next->count;
              if (newSize == next->max) {
                pcStack_8 = pcVar3;
                FastVector<char_*,_false,_false>::grow_and_add(next,newSize,&pcStack_8);
              }
              else {
                pppcVar2 = &next->data;
                next->count = newSize + 1;
                (*pppcVar2)[newSize] = pcVar3;
              }
            }
          }
        }
      }
      return;
    }
  }
  return;
}

Assistant:

void CheckFunction(char* ptr)
	{
		NULLCFuncPtr *fPtr = (NULLCFuncPtr*)ptr;

		// If there's no context, there's nothing to check
		if(!fPtr->context)
			return;

		const ExternFuncInfo &func = NULLC::commonLinker->exFunctions[fPtr->id];

		// External functions shouldn't be checked
		if(func.regVmAddress == -1)
			return;

		// If context is "this" pointer
		if(func.contextType != ~0u)
			CheckPointer((char*)&fPtr->context);
	}